

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

void test_all_maps<HashObject<256,32>>(int obj_size,int iters)

{
  size_type *psVar1;
  double dVar2;
  ulong uVar3;
  iterator iVar4;
  bool bVar5;
  int i;
  uint uVar6;
  value_type *pvVar7;
  value_type *pvVar8;
  ulong uVar9;
  uint *puVar10;
  iterator iVar11;
  iterator iVar12;
  _Rb_tree_node_base *p_Var13;
  size_t sVar14;
  ulong uVar15;
  size_t start_memory;
  size_t start_memory_00;
  size_t start_memory_01;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  size_t start_memory_05;
  size_t start_memory_06;
  size_t start_memory_07;
  size_t start_memory_08;
  size_t start_memory_09;
  size_t start_memory_10;
  size_t start_memory_11;
  size_t start_memory_12;
  size_t start_memory_13;
  size_t start_memory_14;
  size_t start_memory_15;
  size_t start_memory_16;
  size_t start_memory_17;
  size_t start_memory_18;
  size_t start_memory_19;
  size_t start_memory_20;
  size_t start_memory_21;
  size_t start_memory_22;
  size_t start_memory_23;
  size_t start_memory_24;
  size_t start_memory_25;
  size_t start_memory_26;
  _Rb_tree_color __seed;
  uint uVar16;
  size_type req_elements;
  uint uVar17;
  __node_base *p_Var18;
  Rusage t;
  two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>_>
  tStack_410;
  iterator iStack_3f0;
  iterator local_3e8;
  iterator iStack_3e0;
  nonempty_iterator local_3d8;
  Rusage t_3;
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> set_14;
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> set;
  pointer local_80;
  Rusage t_13;
  iterator iStack_70;
  iterator iStack_50;
  iterator local_48;
  iterator iStack_40;
  nonempty_iterator local_38;
  
  uVar16 = 0;
  sVar14 = (size_t)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",0x100);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar6 = 0;
  if (0 < obj_size) {
    uVar6 = obj_size;
  }
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar7 = google::
             sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(key_type *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar7->second = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_grow",dVar2,obj_size,start_memory,sVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  req_elements = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)&set,req_elements);
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar7 = google::
             sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(key_type *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar7->second = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar2,obj_size,start_memory_00,sVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar7 = google::
             sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(key_type *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar7->second = uVar16;
  }
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar7 = google::
             sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(key_type *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar7->second = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_replace",dVar2,obj_size,start_memory_01,sVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             .rep.table.groups);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&set_14);
  uVar3 = (ulong)uVar6;
  for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
    *(int *)(CONCAT44(set.
                      super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                      .rep.settings.
                      super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
                      enlarge_threshold_._4_4_,
                      (uint)set.
                            super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                            .rep.settings.
                            super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                            .enlarge_threshold_) + uVar15 * 4) = (int)uVar15;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseSparseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&set_14);
  sVar14 = CONCAT44(set.
                    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                    .rep.settings.
                    super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
                    enlarge_threshold_._4_4_,
                    (uint)set.
                          super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                          .rep.settings.
                          super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                          .enlarge_threshold_);
  for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
    *(int *)(sVar14 + uVar15 * 4) = (int)uVar15;
  }
  time_map_fetch<EasyUseSparseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t_3);
  Rusage::Reset(&t_3);
  uVar16 = 1;
  for (uVar17 = 0; uVar6 != uVar17; uVar17 = uVar17 + 1) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar17);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar17,0xfc);
    google::
    sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
    ::find<HashObject<256,32>>
              ((iterator *)&t,
               (sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                *)&set,(HashObject<256,_32> *)&set_14);
    google::
    sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::end((iterator *)&t_13,
          (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
           *)&set);
    bVar5 = google::
            two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>_>
            ::operator!=(&tStack_410,&iStack_70);
    uVar16 = uVar16 ^ bVar5;
  }
  dVar2 = Rusage::UserTime(&t_3);
  srand(uVar16);
  report("map_fetch_empty",dVar2,obj_size,start_memory_02,sVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar7 = google::
             sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(key_type *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar7->second = uVar16;
  }
  Rusage::Reset(&t);
  for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    google::
    sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::erase((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             *)&set,(key_type *)&set_14);
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_remove",dVar2,obj_size,start_memory_03,sVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar16 = 0;
  uVar17 = uVar6;
  while (bVar5 = uVar17 != 0, uVar17 = uVar17 - 1, bVar5) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar7 = google::
             sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(key_type *)&set_14);
    pvVar7->second = uVar16 + 1;
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16 & 0xff,0xfc);
    google::
    sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::erase((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             *)&set,(key_type *)&set_14);
    uVar16 = uVar16 + 1;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_toggle",dVar2,obj_size,start_memory_04,sVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t_3);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar7 = google::
             sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(key_type *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar7->second = uVar16;
  }
  Rusage::Reset(&t_3);
  google::
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::begin((iterator *)&t,
          (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
           *)&set);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets = (__buckets_ptr)t.start_.__d.__r;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = (size_type)tStack_410.row_begin._M_current;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)tStack_410.row_end._M_current;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = (size_type)tStack_410.row_current._M_current;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._0_8_ = tStack_410.col_current;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = (size_t)iStack_3f0._M_current;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)local_3e8._M_current;
  google::
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::end((iterator *)&t_13,
        (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
         *)&set);
  t = t_13;
  tStack_410.row_begin._M_current = iStack_70.row_begin._M_current;
  tStack_410.row_end._M_current = iStack_70.row_end._M_current;
  tStack_410.row_current._M_current = iStack_70.row_current._M_current;
  tStack_410.col_current = iStack_70.col_current;
  iStack_3f0._M_current = iStack_50._M_current;
  local_3e8._M_current = local_48._M_current;
  iStack_3e0._M_current = iStack_40._M_current;
  local_3d8 = local_38;
  uVar16 = 1;
  while( true ) {
    bVar5 = google::
            const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>_>
            ::operator!=((const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>_>
                          *)&set_14.
                             super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                             ._M_h._M_bucket_count,(iterator *)&tStack_410);
    if (!bVar5) break;
    uVar16 = uVar16 ^ *(uint *)(set_14.
                                super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                                ._M_h._M_rehash_policy._0_8_ + 0x100);
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::operator++((sparse_hashtable_const_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                  *)&set_14);
  }
  dVar2 = Rusage::UserTime(&t_3);
  srand(uVar16);
  report("map_iterate",dVar2,obj_size,start_memory_05,sVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             .rep.table.groups);
  uVar16 = 0;
  sVar14 = (size_t)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",0x100);
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar8 = google::
             dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::find_or_insert<int,HashObject<256,32>>
                       ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(HashObject<256,_32> *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar8->second = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_grow",dVar2,obj_size,start_memory_06,sVar14);
  free(local_80);
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  google::
  dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)&set,req_elements);
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar8 = google::
             dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::find_or_insert<int,HashObject<256,32>>
                       ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(HashObject<256,_32> *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar8->second = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar2,obj_size,start_memory_07,sVar14);
  free(local_80);
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar8 = google::
             dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::find_or_insert<int,HashObject<256,32>>
                       ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(HashObject<256,_32> *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar8->second = uVar16;
  }
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar8 = google::
             dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::find_or_insert<int,HashObject<256,32>>
                       ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(HashObject<256,_32> *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar8->second = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_replace",dVar2,obj_size,start_memory_08,sVar14);
  free(local_80);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&set_14);
  for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
    *(int *)(CONCAT44(set.
                      super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                      .rep.settings.
                      super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
                      enlarge_threshold_._4_4_,
                      (uint)set.
                            super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                            .rep.settings.
                            super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                            .enlarge_threshold_) + uVar15 * 4) = (int)uVar15;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseDenseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&set_14);
  uVar15 = CONCAT44(set.
                    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                    .rep.settings.
                    super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
                    enlarge_threshold_._4_4_,
                    (uint)set.
                          super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                          .rep.settings.
                          super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                          .enlarge_threshold_);
  for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
    *(int *)(uVar15 + uVar9 * 4) = (int)uVar9;
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t_3);
  Rusage::Reset(&t_3);
  uVar16 = 1;
  for (uVar17 = 0; uVar6 != uVar17; uVar17 = uVar17 + 1) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar17);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar17,0xfc);
    google::
    dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
    ::find<HashObject<256,32>>
              ((iterator *)&t,
               (dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                *)&set,(HashObject<256,_32> *)&set_14);
    google::
    dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::end((iterator *)&t_13,
          (dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
           *)&set);
    uVar15 = (ulong)(tStack_410.row_begin._M_current != iStack_70.row_begin._M_current);
    uVar16 = uVar16 ^ tStack_410.row_begin._M_current != iStack_70.row_begin._M_current;
  }
  dVar2 = Rusage::UserTime(&t_3);
  srand(uVar16);
  report("map_fetch_empty",dVar2,obj_size,start_memory_09,uVar15);
  free(local_80);
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar8 = google::
             dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::find_or_insert<int,HashObject<256,32>>
                       ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(HashObject<256,_32> *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar8->second = uVar16;
  }
  Rusage::Reset(&t);
  for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    google::
    dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::erase((dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             *)&set,(key_type *)&set_14);
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_remove",dVar2,obj_size,start_memory_10,uVar15);
  free(local_80);
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar16 = uVar6;
  uVar17 = 0;
  while (bVar5 = uVar16 != 0, uVar16 = uVar16 - 1, bVar5) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar17);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar17,0xfc);
    pvVar8 = google::
             dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::find_or_insert<int,HashObject<256,32>>
                       ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(HashObject<256,_32> *)&set_14);
    pvVar8->second = uVar17 + 1;
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar17);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar17 & 0xff,0xfc);
    google::
    dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::erase((dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             *)&set,(HashObject<256,_32> *)&set_14);
    uVar17 = uVar17 + 1;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_toggle",dVar2,obj_size,start_memory_11,uVar15);
  free(local_80);
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t_13);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set_14.
    super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT44(set_14.
                  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                  ._M_h._M_buckets._4_4_,uVar16);
    memset((void *)((long)&set_14.
                           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           ._M_h._M_buckets + 4),uVar16,0xfc);
    pvVar8 = google::
             dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
             ::find_or_insert<int,HashObject<256,32>>
                       ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                         *)&set,(HashObject<256,_32> *)&set_14);
    uVar16 = uVar16 + 1;
    pvVar8->second = uVar16;
  }
  Rusage::Reset(&t_13);
  google::
  dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::begin((iterator *)&t,
          (dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
           *)&set);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets = (__buckets_ptr)t.start_.__d.__r;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = (size_type)tStack_410.row_begin._M_current;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)tStack_410.row_end._M_current;
  google::
  dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::end((iterator *)&t,
        (dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
         *)&set);
  iVar4._M_current = tStack_410.row_begin._M_current;
  uVar16 = 1;
  while( true ) {
    if ((sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
         *)set_14.
           super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
           ._M_h._M_bucket_count == iVar4._M_current) break;
    uVar16 = uVar16 ^ *(uint *)(set_14.
                                super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                                ._M_h._M_bucket_count + 0x100);
    google::
    dense_hashtable_const_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::operator++((dense_hashtable_const_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                  *)&set_14);
  }
  dVar2 = Rusage::UserTime(&t_13);
  srand(uVar16);
  report("map_iterate",dVar2,obj_size,start_memory_12,uVar15);
  free(local_80);
  uVar16 = 0;
  sVar14 = (size_t)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",0x100);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets =
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_single_bucket;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = 1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::__detail::
                      _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_grow",dVar2,obj_size,start_memory_13,sVar14);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets =
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_single_bucket;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = 1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Rusage::Rusage(&t);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)&set_14,req_elements);
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::__detail::
                      _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar2,obj_size,start_memory_14,sVar14);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets =
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_single_bucket;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = 1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::__detail::
                      _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::__detail::
                      _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_replace",dVar2,obj_size,start_memory_15,sVar14);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set_14);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&set_14);
  for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
    *(int *)(CONCAT44(set.
                      super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                      .rep.settings.
                      super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
                      enlarge_threshold_._4_4_,
                      (uint)set.
                            super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                            .rep.settings.
                            super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                            .enlarge_threshold_) + uVar15 * 4) = (int)uVar15;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&set_14);
  uVar15 = CONCAT44(set.
                    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                    .rep.settings.
                    super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
                    enlarge_threshold_._4_4_,
                    (uint)set.
                          super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                          .rep.settings.
                          super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                          .enlarge_threshold_);
  for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
    *(int *)(uVar15 + uVar9 * 4) = (int)uVar9;
  }
  time_map_fetch<EasyUseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets =
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_single_bucket;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = 1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar16 = 1;
  for (uVar17 = 0; uVar6 != uVar17; uVar17 = uVar17 + 1) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar17;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar17,0xfc);
    iVar11 = std::
             _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&set_14,(key_type *)&set);
    uVar15 = (ulong)(iVar11.
                     super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>.
                     _M_cur != (__node_type *)0x0);
    uVar16 = uVar16 ^ iVar11.
                      super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>.
                      _M_cur != (__node_type *)0x0;
  }
  dVar2 = Rusage::UserTime(&t);
  srand(uVar16);
  report("map_fetch_empty",dVar2,obj_size,start_memory_16,uVar15);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets =
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_single_bucket;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = 1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::__detail::
                      _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  Rusage::Reset(&t);
  for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    std::
    _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&set_14,&set);
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_remove",dVar2,obj_size,start_memory_17,uVar15);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets =
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_single_bucket;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = 1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar16 = uVar6;
  uVar17 = 0;
  while (bVar5 = uVar16 != 0, uVar16 = uVar16 - 1, bVar5) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar17;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar17,0xfc);
    puVar10 = (uint *)std::__detail::
                      _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&set_14,(key_type *)&set);
    *puVar10 = uVar17 + 1;
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar17;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar17 & 0xff,0xfc);
    std::
    _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&set_14,(key_type *)&set);
    uVar17 = uVar17 + 1;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_toggle",dVar2,obj_size,start_memory_18,uVar15);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets =
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_single_bucket;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = 1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Rusage::Rusage(&t);
  p_Var18 = &set_14.
             super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             ._M_h._M_before_begin;
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::__detail::
                      _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  Rusage::Reset(&t);
  uVar16 = 1;
  psVar1 = &set_14.
            super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
            ._M_h._M_bucket_count;
  while( true ) {
    p_Var18 = p_Var18->_M_nxt;
    if (p_Var18 == (__node_base *)0x0) break;
    uVar16 = uVar16 ^ *(uint *)&p_Var18[0x21]._M_nxt;
  }
  dVar2 = Rusage::UserTime(&t);
  srand(uVar16);
  report("map_iterate",dVar2,obj_size,start_memory_19,uVar15);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set_14);
  uVar16 = 0;
  sVar14 = (size_t)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",0x100);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_bucket_count & 0xffffffff00000000;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = (size_type)psVar1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._0_8_ = psVar1;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::
                      map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_grow",dVar2,obj_size,start_memory_20,sVar14);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_bucket_count & 0xffffffff00000000;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = (size_type)psVar1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._0_8_ = psVar1;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::
                      map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar2,obj_size,start_memory_21,sVar14);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_bucket_count & 0xffffffff00000000;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count =
       (size_type)
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_bucket_count;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_element_count;
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::
                      map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::
                      map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_replace",dVar2,obj_size,start_memory_22,sVar14);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)&set_14);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&set_14);
  psVar1 = &set_14.
            super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
            ._M_h._M_bucket_count;
  for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
    *(int *)(CONCAT44(set.
                      super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                      .rep.settings.
                      super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
                      enlarge_threshold_._4_4_,
                      (uint)set.
                            super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                            .rep.settings.
                            super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                            .enlarge_threshold_) + uVar15 * 4) = (int)uVar15;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseMap<HashObject<256,32>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&set_14);
  uVar15 = CONCAT44(set.
                    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                    .rep.settings.
                    super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
                    enlarge_threshold_._4_4_,
                    (uint)set.
                          super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                          .rep.settings.
                          super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                          .enlarge_threshold_);
  for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
    *(int *)(uVar15 + uVar9 * 4) = (int)uVar9;
  }
  time_map_fetch<EasyUseMap<HashObject<256,32>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_bucket_count & 0xffffffff00000000;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = (size_type)psVar1;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._0_8_ = psVar1;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar16 = 1;
  for (uVar17 = 0; uVar6 != uVar17; uVar17 = uVar17 + 1) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar17;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar17,0xfc);
    iVar12 = std::
             _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             ::find((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                     *)&set_14,(key_type *)&set);
    bVar5 = iVar12._M_node !=
            (_Base_ptr)
            &set_14.
             super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             ._M_h._M_bucket_count;
    uVar15 = (ulong)bVar5;
    uVar16 = uVar16 ^ bVar5;
  }
  dVar2 = Rusage::UserTime(&t);
  srand(uVar16);
  report("map_fetch_empty",dVar2,obj_size,start_memory_23,uVar15);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_bucket_count & 0xffffffff00000000;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count =
       (size_type)
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_bucket_count;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_element_count;
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::
                      map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  Rusage::Reset(&t);
  for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    std::
    _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::erase((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             *)&set_14,(key_type *)&set);
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_remove",dVar2,obj_size,start_memory_24,uVar15);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_bucket_count & 0xffffffff00000000;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count =
       (size_type)
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_bucket_count;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_element_count;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar16 = uVar6;
  uVar17 = 0;
  while (bVar5 = uVar16 != 0, uVar16 = uVar16 - 1, bVar5) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar17;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar17,0xfc);
    puVar10 = (uint *)std::
                      map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                                    *)&set_14,(key_type *)&set);
    *puVar10 = uVar17 + 1;
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar17;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar17 & 0xff,0xfc);
    std::
    _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::erase((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             *)&set_14,(key_type *)&set);
    uVar17 = uVar17 + 1;
  }
  dVar2 = Rusage::UserTime(&t);
  report("map_toggle",dVar2,obj_size,start_memory_25,uVar15);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)&set_14);
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_bucket_count & 0xffffffff00000000;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count =
       (size_type)
       &set_14.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_bucket_count;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set_14.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_element_count;
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar6 != uVar16) {
    set.
    super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    .rep.settings.super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_._0_4_ = uVar16;
    memset((void *)((long)&set.
                           super_sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                           .rep.settings.
                           super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>
                           .enlarge_threshold_ + 4),uVar16,0xfc);
    puVar10 = (uint *)std::
                      map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                                    *)&set_14,(key_type *)&set);
    uVar16 = uVar16 + 1;
    *puVar10 = uVar16;
  }
  Rusage::Reset(&t);
  __seed = _S_black;
  for (p_Var13 = (_Rb_tree_node_base *)
                 set_14.
                 super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                 ._M_h._M_element_count;
      p_Var13 !=
      (_Rb_tree_node_base *)
      &set_14.
       super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
       ._M_h._M_bucket_count; p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    __seed = __seed ^ p_Var13[9]._M_color;
  }
  dVar2 = Rusage::UserTime(&t);
  srand(__seed);
  report("map_iterate",dVar2,obj_size,start_memory_26,uVar15);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)&set_14);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}